

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::IsSpent(CWallet *this,COutPoint *outpoint)

{
  long lVar1;
  bool bVar2;
  pointer pvVar3;
  key_type *in_RDI;
  long in_FS_OFFSET;
  CWalletTx *wtx;
  uint256 *wtxid;
  const_iterator mit;
  const_iterator it;
  pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  range;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  *in_stack_ffffffffffffff98;
  bool local_41;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  ::
  pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_true>
            ((pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
              *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::
  unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
  ::equal_range((unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
                 *)in_stack_ffffffffffffff98,in_RDI);
  std::
  pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  ::operator=(in_stack_ffffffffffffff98,(type)in_RDI);
  do {
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
                       in_stack_ffffffffffffff98,
                       (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)in_RDI);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_41 = false;
LAB_001a775f:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return local_41;
    }
    std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    std::
    unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
    ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
            *)in_RDI,(key_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    std::
    unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
    ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
           *)in_RDI);
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_stack_ffffffffffffff98,
                       (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_RDI);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
               operator->((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
                           *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff98 =
           (pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
            *)&pvVar3->second;
      bVar2 = CWalletTx::isAbandoned((CWalletTx *)in_stack_ffffffffffffff98);
      if (((!bVar2) &&
          (bVar2 = CWalletTx::isBlockConflicted
                             ((CWalletTx *)
                              CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)), !bVar2
          )) && (bVar2 = CWalletTx::isMempoolConflicted
                                   ((CWalletTx *)
                                    CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
                !bVar2)) {
        local_41 = true;
        goto LAB_001a775f;
      }
    }
    std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  } while( true );
}

Assistant:

bool CWallet::IsSpent(const COutPoint& outpoint) const
{
    std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range;
    range = mapTxSpends.equal_range(outpoint);

    for (TxSpends::const_iterator it = range.first; it != range.second; ++it) {
        const uint256& wtxid = it->second;
        const auto mit = mapWallet.find(wtxid);
        if (mit != mapWallet.end()) {
            const auto& wtx = mit->second;
            if (!wtx.isAbandoned() && !wtx.isBlockConflicted() && !wtx.isMempoolConflicted())
                return true; // Spent
        }
    }
    return false;
}